

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::QueryGraphManager::Build
          (QueryGraphManager *this,JoinOrderOptimizer *optimizer,LogicalOperator *op)

{
  bool bVar1;
  LogicalOperator *op_00;
  bool bVar2;
  vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  local_58;
  vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  local_38;
  
  bVar1 = RelationManager::ExtractJoinRelations
                    (&this->relation_manager,optimizer,op,&this->filter_operators,
                     (optional_ptr<duckdb::LogicalOperator,_true>)0x0);
  bVar2 = 8 < (ulong)((long)(this->relation_manager).relations.
                            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->relation_manager).relations.
                           super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  if (bVar2 && bVar1) {
    RelationManager::ExtractEdges
              ((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                *)&local_58,&this->relation_manager,op_00,&this->filter_operators,&this->set_manager
              );
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->filters_and_bindings).
         super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->filters_and_bindings).
    super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->filters_and_bindings).
         super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->filters_and_bindings).
         super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->filters_and_bindings).
    super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->filters_and_bindings).
    super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ::~vector(&local_38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
    ::~vector(&local_58);
    CreateHyperGraphEdges(this);
  }
  return bVar2 && bVar1;
}

Assistant:

bool QueryGraphManager::Build(JoinOrderOptimizer &optimizer, LogicalOperator &op) {
	// have the relation manager extract the join relations and create a reference list of all the
	// filter operators.
	auto can_reorder = relation_manager.ExtractJoinRelations(optimizer, op, filter_operators);
	auto num_relations = relation_manager.NumRelations();
	if (num_relations <= 1 || !can_reorder) {
		// nothing to optimize/reorder
		return false;
	}
	// extract the edges of the hypergraph, creating a list of filters and their associated bindings.
	filters_and_bindings = relation_manager.ExtractEdges(op, filter_operators, set_manager);
	// Create the query_graph hyper edges
	CreateHyperGraphEdges();
	return true;
}